

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O2

int __thiscall MGARD::Recomposer<float>::init(Recomposer<float> *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  unsigned_long uVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  float *pfVar4;
  size_t __size;
  
  uVar1 = this->default_batch_size;
  _Var3 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (*(undefined8 *)ctx,*(undefined8 *)(ctx + 8));
  uVar2 = *_Var3._M_current;
  free(this->data_buffer);
  free(this->correction_buffer);
  free(this->load_v_buffer);
  __size = uVar1 * uVar2 * 4;
  pfVar4 = (float *)malloc(this->data_buffer_size);
  this->data_buffer = pfVar4;
  pfVar4 = (float *)malloc(__size);
  this->correction_buffer = pfVar4;
  pfVar4 = (float *)malloc(__size);
  this->load_v_buffer = pfVar4;
  return (int)pfVar4;
}

Assistant:

void init(const vector<size_t>& dims){
		size_t buffer_size = default_batch_size * (*max_element(dims.begin(), dims.end())) * sizeof(T);
		// cerr << "buffer_size = " << buffer_size << endl;
		// cerr << "data_buffer_size = " << data_buffer_size << endl;
		if(data_buffer) free(data_buffer);
		if(correction_buffer) free(correction_buffer);
		if(load_v_buffer) free(load_v_buffer);
		data_buffer = (T *) malloc(data_buffer_size);
		correction_buffer = (T *) malloc(buffer_size);
		load_v_buffer = (T *)malloc(buffer_size);
	}